

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O2

void traverse_hplane_fast_colmajor<PredictionData<double,unsigned_long>,unsigned_long>
               (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *hplane,ExtIsoForest *model_outputs,
               PredictionData<double,_unsigned_long> *prediction_data,double *output_depth,
               unsigned_long *tree_num,double *tree_depth,size_t row)

{
  pointer pIVar1;
  pointer pIVar2;
  long lVar3;
  size_t sVar4;
  size_t col;
  long lVar5;
  double dVar6;
  
  pIVar2 = (hplane->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
           super__Vector_impl_data._M_start;
  sVar4 = 0;
  while (pIVar1 = pIVar2 + sVar4, pIVar2[sVar4].hplane_left != 0) {
    lVar3 = *(long *)&(pIVar1->col_num).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
    dVar6 = 0.0;
    for (lVar5 = 0;
        (long)*(pointer *)
               ((long)&(pIVar1->col_num).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8
               ) - lVar3 >> 3 != lVar5; lVar5 = lVar5 + 1) {
      dVar6 = dVar6 + (prediction_data->numeric_data
                       [row + *(long *)(lVar3 + lVar5 * 8) * prediction_data->nrows] -
                      *(double *)
                       (*(long *)&(pIVar1->mean).super__Vector_base<double,_std::allocator<double>_>
                                  ._M_impl.super__Vector_impl_data + lVar5 * 8)) *
                      *(double *)
                       (*(long *)&(pIVar1->coef).super__Vector_base<double,_std::allocator<double>_>
                                  ._M_impl.super__Vector_impl_data + lVar5 * 8);
    }
    sVar4 = (&pIVar1->hplane_left)[pIVar1->split_point < dVar6];
  }
  dVar6 = pIVar1->score;
  *output_depth = *output_depth + dVar6;
  if (tree_num != (unsigned_long *)0x0) {
    tree_num[row] = sVar4;
  }
  if (tree_depth != (double *)0x0) {
    *tree_depth = dVar6;
  }
  return;
}

Assistant:

void traverse_hplane_fast_colmajor(std::vector<IsoHPlane>  &hplane,
                                   ExtIsoForest            &model_outputs,
                                   PredictionData          &prediction_data,
                                   double &restrict        output_depth,
                                   sparse_ix *restrict     tree_num,
                                   double *restrict        tree_depth,
                                   size_t                  row) noexcept
{
    size_t  curr_lev = 0;
    double  hval;

    while(true)
    {
        // if (hplane[curr_lev].score > 0)
        if (unlikely(hplane[curr_lev].hplane_left == 0))
        {
            output_depth += hplane[curr_lev].score;
            if (unlikely(tree_num != NULL))
                tree_num[row] = curr_lev;
            if (unlikely(tree_depth != NULL))
                *tree_depth = hplane[curr_lev].score;
            return;
        }

        else
        {
            hval = 0;
            for (size_t col = 0; col < hplane[curr_lev].col_num.size(); col++)
                hval += (prediction_data.numeric_data[row +  hplane[curr_lev].col_num[col] * prediction_data.nrows] 
                         - hplane[curr_lev].mean[col]) * hplane[curr_lev].coef[col];

            curr_lev  = (hval <= hplane[curr_lev].split_point)?
                         hplane[curr_lev].hplane_left : hplane[curr_lev].hplane_right;

        }
    }
}